

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20240722::container_internal::
     raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  size_t sVar1;
  ulong uVar2;
  ctrl_t *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  bool bVar8;
  uint *puVar9;
  slot_type *psVar10;
  ulong uVar11;
  byte bVar12;
  size_t sVar13;
  ctrl_t cVar14;
  ulong uVar15;
  FindInfo FVar16;
  HashSetResizeHelper resize_helper;
  undefined1 local_52;
  undefined1 local_51;
  HeapOrSoo local_50;
  size_t local_40;
  byte local_38;
  char local_37;
  undefined1 local_36;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("IsValidCapacity(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe14,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("!set->fits_in_soo(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe15,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  sVar1 = common->capacity_;
  if (sVar1 == 0) {
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  uVar2 = common->size_;
  bVar12 = 0x80;
  if (1 < uVar2 && sVar1 == 1) {
    puVar9 = (uint *)soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                               *)common);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (ulong)*puVar9;
    bVar12 = (SUB161(auVar4 * ZEXT816(0x9ddfea08eb382d69),8) ^
             SUB161(auVar4 * ZEXT816(0x9ddfea08eb382d69),0)) & 0x7f;
  }
  local_40 = common->capacity_;
  local_38 = (byte)common->size_ & 1;
  local_37 = sVar1 == 1;
  local_50._0_4_ = *(undefined4 *)&common->heap_or_soo_;
  local_50._4_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 4);
  local_50._8_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 8);
  local_50._12_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 0xc);
  common->capacity_ = new_capacity;
  local_36 = 1 < uVar2 && sVar1 == 1;
  bVar8 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,4ul,true,true,4ul>
                    ((HashSetResizeHelper *)&local_50,common,&local_51,(int)(char)bVar12,4,4);
  if (local_40 == 0) {
    __assert_fail("resize_helper.old_capacity() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe38,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  if (sVar1 != 1 || 1 < uVar2) {
    psVar10 = slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                          *)common);
    if (!bVar8) {
      if (sVar1 == 1) {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (ulong)(uint)local_50._0_4_;
        uVar15 = SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8) ^
                 SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0);
        FVar16 = absl::lts_20240722::container_internal::find_first_non_full<void>(common,uVar15);
        uVar11 = FVar16.offset;
        uVar2 = common->capacity_;
        if (uVar2 <= uVar11) {
LAB_00238752:
          __assert_fail("i < c.capacity()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x70c,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar14 = (ctrl_t)uVar15 & ~kEmpty;
        pcVar3 = (common->heap_or_soo_).heap.control;
        pcVar3[uVar11] = cVar14;
        pcVar3[(ulong)((uint)uVar2 & 0xf) + (uVar11 - 0xf & uVar2)] = cVar14;
        psVar10[uVar11] = local_50._0_4_;
      }
      else {
        if (local_37 == '\x01') {
          __assert_fail("!was_soo_",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7c2,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_40 != 0) {
          lVar7 = CONCAT44(local_50._12_4_,local_50._8_4_);
          sVar13 = 0;
          do {
            if (local_37 == '\x01') {
              __assert_fail("!was_soo_",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7be,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (-1 < *(char *)(CONCAT44(local_50._4_4_,local_50._0_4_) + sVar13)) {
              auVar6._8_8_ = 0;
              auVar6._0_8_ = (long)&hash_internal::MixingHashState::kSeed +
                             (ulong)*(uint *)(lVar7 + sVar13 * 4);
              uVar15 = SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),8) ^
                       SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),0);
              FVar16 = absl::lts_20240722::container_internal::find_first_non_full<void>
                                 (common,uVar15);
              uVar11 = FVar16.offset;
              uVar2 = common->capacity_;
              if (uVar2 <= uVar11) goto LAB_00238752;
              cVar14 = (ctrl_t)uVar15 & ~kEmpty;
              pcVar3 = (common->heap_or_soo_).heap.control;
              pcVar3[uVar11] = cVar14;
              pcVar3[(ulong)((uint)uVar2 & 0xf) + (uVar11 - 0xf & uVar2)] = cVar14;
              psVar10[uVar11] = *(slot_type *)(lVar7 + sVar13 * 4);
            }
            sVar13 = sVar13 + 1;
          } while (sVar13 != local_40);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      if (sVar1 != 1) {
        HashSetResizeHelper::DeallocateOld<4ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_50,&local_52,4);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }